

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O1

void free_rule(ip_rule_t *ipr)

{
  list_head *plVar1;
  list_head *plVar2;
  void *p;
  
  if (ipr != (ip_rule_t *)0x0) {
    plVar1 = (ipr->list).next;
    plVar1->prev = (ipr->list).prev;
    ((ipr->list).prev)->next = plVar1;
    (ipr->list).next = (list_head *)0x0;
    (ipr->list).prev = (list_head *)0x0;
    plVar1 = (ipr->matchs).next;
    while (plVar1 != &ipr->matchs) {
      plVar2 = plVar1->next;
      plVar2->prev = plVar1->prev;
      plVar1->prev->next = plVar2;
      plVar1->next = (list_head *)0x0;
      plVar1->prev = (list_head *)0x0;
      if (plVar1[-1].prev != (list_head *)0x0) {
        mwFree(plVar1[-1].prev,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
               0x3e);
        plVar1[-1].prev = (list_head *)0x0;
      }
      mwFree(plVar1 + -1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",0x3f)
      ;
      plVar1 = plVar2;
    }
    if (ipr->target_ext != (ip_target_t *)0x0) {
      p = ipr->target_ext->data;
      if (p != (void *)0x0) {
        mwFree(p,"/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
               0x51);
        ipr->target_ext->data = (void *)0x0;
      }
      if (ipr->target_ext != (ip_target_t *)0x0) {
        mwFree(ipr->target_ext,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
               0x52);
        ipr->target_ext = (ip_target_t *)0x0;
      }
    }
    mwFree(ipr,"/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
           0x55);
    return;
  }
  return;
}

Assistant:

static void free_rule(ip_rule_t *ipr)
{
	if (ipr == NULL) {
		return;
	}

	list_del(&ipr->list);

	ip_match_t *p = NULL, *q = NULL;

	list_for_each_entry_safe(p, q, &ipr->matchs, list) {
		free_match(p);
	}

	if (ipr->target_ext) {
		_free(ipr->target_ext->data);
		_free(ipr->target_ext);
	}

	_free(ipr);
}